

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.h
# Opt level: O3

bool __thiscall Memory::Recycler::HasPendingMarkObjects(Recycler *this)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty(&(this->markContext).markStack);
  bVar2 = true;
  if (bVar1) {
    bVar1 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty
                      (&(this->parallelMarkContext1).markStack);
    if (bVar1) {
      bVar1 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty
                        (&(this->parallelMarkContext2).markStack);
      if (bVar1) {
        bVar2 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty
                          (&(this->parallelMarkContext3).markStack);
        bVar2 = !bVar2;
      }
    }
  }
  return bVar2;
}

Assistant:

bool HasPendingMarkObjects() const { return markContext.HasPendingMarkObjects() || parallelMarkContext1.HasPendingMarkObjects() || parallelMarkContext2.HasPendingMarkObjects() || parallelMarkContext3.HasPendingMarkObjects(); }